

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

SimpleString __thiscall TestFailure::createUserText(TestFailure *this,SimpleString *text)

{
  SimpleString *this_00;
  bool bVar1;
  SimpleString *in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  SimpleString SVar3;
  SimpleString local_48 [2];
  undefined1 local_21;
  SimpleString *local_20;
  SimpleString *text_local;
  TestFailure *this_local;
  SimpleString *userMessage;
  
  local_21 = 0;
  local_20 = in_RDX;
  text_local = text;
  this_local = this;
  SimpleString::SimpleString((SimpleString *)this,"");
  bVar1 = SimpleString::isEmpty(local_20);
  this_00 = local_20;
  sVar2 = extraout_RDX;
  if (!bVar1) {
    SimpleString::SimpleString(local_48,"LONGS_EQUAL");
    bVar1 = SimpleString::startsWith(this_00,local_48);
    SimpleString::~SimpleString(local_48);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      SimpleString::operator+=((SimpleString *)this,"Message: ");
    }
    SimpleString::operator+=((SimpleString *)this,local_20);
    SimpleString::operator+=((SimpleString *)this,"\n\t");
    sVar2 = extraout_RDX_00;
  }
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString TestFailure::createUserText(const SimpleString& text)
{
    SimpleString userMessage = "";
    if (!text.isEmpty())
    {
        //This is a kludge to turn off "Message: " for this case.
        //I don't think "Message: " adds anything, as you get to see the
        //message. I propose we remove "Message: " lead in
        if (!text.startsWith("LONGS_EQUAL"))
            userMessage += "Message: ";
        userMessage += text;
        userMessage += "\n\t";
    }
    return userMessage;
}